

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2TestPackage.cpp
# Opt level: O1

void __thiscall deqp::gles2::TestPackage::~TestPackage(TestPackage *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Context *this_00;
  pointer pcVar2;
  
  (this->super_TestPackage).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestPackage_021692a0
  ;
  tcu::TestNode::deinit((TestNode *)this);
  this_00 = this->m_context;
  if (this_00 != (Context *)0x0) {
    Context::~Context(this_00);
    operator_delete(this_00,0x18);
  }
  (this->m_archive).super_Archive._vptr_Archive = (_func_int **)&PTR__ResourcePrefix_021d3708;
  pcVar2 = (this->m_archive).m_prefix._M_dataplus._M_p;
  paVar1 = &(this->m_archive).m_prefix.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  tcu::TestPackage::~TestPackage(&this->super_TestPackage);
  return;
}

Assistant:

TestPackage::~TestPackage (void)
{
	// Destroy children first since destructors may access context.
	TestNode::deinit();
	delete m_context;
}